

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

void __thiscall Expr::GenCaseEval(Expr *this,Output *out_cc,Env *env)

{
  bool bVar1;
  Type *pTVar2;
  undefined8 uVar3;
  ID *id;
  Env *this_00;
  char *pcVar4;
  reference ppCVar5;
  Expr *this_01;
  Env *env_00;
  int __c;
  Output *in_RSI;
  CaseExpr ***__s;
  long in_RDI;
  Env *unaff_retaddr;
  Expr *in_stack_00000008;
  ExprList *index;
  CaseExpr *c;
  iterator i_1;
  CaseExpr *default_case;
  Type *switch_type;
  iterator i;
  ID *val_var;
  Type *val_type;
  ID *in_stack_fffffffffffffe78;
  Output *pOVar6;
  Env *in_stack_fffffffffffffe80;
  Output *in_stack_fffffffffffffe88;
  Expr *in_stack_fffffffffffffe90;
  ID *in_stack_fffffffffffffea0;
  Env *in_stack_fffffffffffffea8;
  Env *in_stack_fffffffffffffeb0;
  allocator<char> *__a;
  Output *in_stack_fffffffffffffeb8;
  Expr *in_stack_fffffffffffffec0;
  CaseExpr *this_02;
  Type *in_stack_fffffffffffffec8;
  Object *o;
  Env *in_stack_fffffffffffffed0;
  undefined1 *puVar7;
  undefined1 v;
  allocator<char> local_e1 [33];
  char *local_c0;
  CaseExpr *local_b8;
  CaseExpr **local_b0;
  __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_> local_a8;
  CaseExpr *local_a0;
  Type *local_98;
  CaseExpr **local_90;
  iterator in_stack_ffffffffffffff78;
  Env *in_stack_ffffffffffffff80;
  Output *in_stack_ffffffffffffff88;
  ExprList *in_stack_ffffffffffffff90;
  
  pTVar2 = DataType(in_stack_00000008,unaff_retaddr);
  Env::AddTempID(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if (pTVar2 == (Type *)0x0) {
    uVar3 = __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
               (allocator<char> *)in_stack_fffffffffffffeb0);
    Exception::Exception
              ((Exception *)in_stack_fffffffffffffeb0,(Object *)in_stack_fffffffffffffea8,
               (string *)in_stack_fffffffffffffea0);
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  puVar7 = &stack0xffffffffffffff80;
  (*(pTVar2->super_DataDepElement)._vptr_DataDepElement[0xb])();
  id = (ID *)std::__cxx11::string::c_str();
  this_00 = (Env *)Env::LValue(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  Output::println(in_RSI,"%s %s;",id,this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  ForceIDEval(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  if (*(long *)(in_RDI + 0xa0) != 0) {
    in_stack_ffffffffffffff78 =
         std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::begin
                   ((vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *)in_stack_fffffffffffffe78);
    while( true ) {
      local_90 = (CaseExpr **)
                 std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::end
                           ((vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *)
                            in_stack_fffffffffffffe78);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                          *)in_stack_fffffffffffffe78);
      if (!bVar1) break;
      ppCVar5 = __gnu_cxx::
                __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                ::operator*((__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                             *)&stack0xffffffffffffff78);
      CaseExpr::value(*ppCVar5);
      ForceIDEval(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      __gnu_cxx::
      __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>::
      operator++((__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                  *)&stack0xffffffffffffff78);
    }
  }
  pOVar6 = in_RSI;
  pcVar4 = EvalExpr(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  Output::println(pOVar6,"switch ( %s )",pcVar4);
  local_98 = DataType(in_stack_00000008,unaff_retaddr);
  Output::inc_indent(in_RSI);
  Output::println(in_RSI,"{");
  v = (undefined1)((ulong)puVar7 >> 0x38);
  local_a0 = (CaseExpr *)0x0;
  if (*(long *)(in_RDI + 0xa0) != 0) {
    local_a8._M_current =
         (CaseExpr **)
         std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::begin
                   ((vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *)in_stack_fffffffffffffe78);
    while( true ) {
      local_b0 = (CaseExpr **)
                 std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::end
                           ((vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *)
                            in_stack_fffffffffffffe78);
      __s = &local_b0;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                          *)in_stack_fffffffffffffe78);
      v = (undefined1)((ulong)puVar7 >> 0x38);
      if (!bVar1) break;
      ppCVar5 = __gnu_cxx::
                __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                ::operator*(&local_a8);
      local_b8 = *ppCVar5;
      local_c0 = CaseExpr::index(local_b8,(char *)__s,__c);
      if (local_c0 == (char *)0x0) {
        if (local_a0 != (CaseExpr *)0x0) {
          pcVar4 = (char *)__cxa_allocate_exception(0x20);
          o = (Object *)0x0;
          if (local_b8 != (CaseExpr *)0x0) {
            o = &local_b8->super_Object;
          }
          __a = local_e1;
          this_02 = local_b8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                     pcVar4,__a);
          Exception::Exception((Exception *)__a,o,(string *)in_stack_fffffffffffffea0);
          __cxa_throw(pcVar4,&Exception::typeinfo,Exception::~Exception);
        }
        local_a0 = local_b8;
      }
      else {
        GenCaseStr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                   (Type *)in_stack_ffffffffffffff78._M_current);
        Output::inc_indent(in_RSI);
        in_stack_fffffffffffffea0 =
             (ID *)Env::LValue(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        CaseExpr::value(local_b8);
        pcVar4 = EvalExpr(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
        Output::println(in_RSI,"%s = %s;",in_stack_fffffffffffffea0,pcVar4);
        Output::println(in_RSI,"break;");
        Output::dec_indent(in_RSI);
      }
      __gnu_cxx::
      __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>::
      operator++(&local_a8);
    }
  }
  GenCaseStr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (Type *)in_stack_ffffffffffffff78._M_current);
  Output::inc_indent(in_RSI);
  if (local_a0 == (CaseExpr *)0x0) {
    pOVar6 = in_RSI;
    env_00 = (Env *)Object::Location((Object *)0x133a31);
    pcVar4 = EvalExpr(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,env_00);
    Output::println(pOVar6,"throw binpac::ExceptionInvalidCaseIndex(\"%s\", (int64)%s);",env_00,
                    pcVar4);
  }
  else {
    pOVar6 = in_RSI;
    this_01 = (Expr *)Env::LValue(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    CaseExpr::value(local_a0);
    pcVar4 = EvalExpr(this_01,pOVar6,in_stack_fffffffffffffe80);
    Output::println(pOVar6,"%s = %s;",this_01,pcVar4);
  }
  Output::println(in_RSI,"break;");
  Output::dec_indent(in_RSI);
  Output::println(in_RSI,"}");
  Output::dec_indent(in_RSI);
  Env::SetEvaluated(this_00,id,(bool)v);
  pcVar4 = Env::RValue(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xa8),pcVar4);
  return;
}

Assistant:

void Expr::GenCaseEval(Output* out_cc, Env* env)
	{
	ASSERT(expr_type_ == EXPR_CASE);
	ASSERT(operand_[0]);
	ASSERT(cases_);

	Type* val_type = DataType(env);
	ID* val_var = env->AddTempID(val_type);

	// DataType(env) can return a null pointer if an enum value is not
	// defined.
	if ( ! val_type )
		throw Exception(this, "undefined case value");

	out_cc->println("%s %s;", val_type->DataTypeStr().c_str(), env->LValue(val_var));

	// force evaluation of IDs appearing in case stmt
	operand_[0]->ForceIDEval(out_cc, env);
	foreach (i, CaseExprList, cases_)
		(*i)->value()->ForceIDEval(out_cc, env);

	out_cc->println("switch ( %s )", operand_[0]->EvalExpr(out_cc, env));
	Type* switch_type = operand_[0]->DataType(env);

	out_cc->inc_indent();
	out_cc->println("{");

	CaseExpr* default_case = nullptr;
	foreach (i, CaseExprList, cases_)
		{
		CaseExpr* c = *i;
		ExprList* index = c->index();
		if ( ! index )
			{
			if ( default_case )
				throw Exception(c, "duplicate default cases");
			default_case = c;
			}
		else
			{
			GenCaseStr(index, out_cc, env, switch_type);
			out_cc->inc_indent();
			out_cc->println("%s = %s;", env->LValue(val_var), c->value()->EvalExpr(out_cc, env));
			out_cc->println("break;");
			out_cc->dec_indent();
			}
		}

	// Generate the default case after all other cases
	GenCaseStr(nullptr, out_cc, env, switch_type);
	out_cc->inc_indent();
	if ( default_case )
		{
		out_cc->println("%s = %s;", env->LValue(val_var),
		                default_case->value()->EvalExpr(out_cc, env));
		}
	else
		{
		out_cc->println("throw binpac::ExceptionInvalidCaseIndex(\"%s\", (int64)%s);", Location(),
		                operand_[0]->EvalExpr(out_cc, env));
		}
	out_cc->println("break;");
	out_cc->dec_indent();

	out_cc->println("}");
	out_cc->dec_indent();

	env->SetEvaluated(val_var);
	str_ = env->RValue(val_var);
	}